

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

int uv__io_check_fd(uv_loop_t *loop,int fd)

{
  int iVar1;
  int *piVar2;
  int local_24;
  undefined1 local_20 [4];
  int rc;
  epoll_event e;
  int fd_local;
  uv_loop_t *loop_local;
  
  e.data.fd = fd;
  unique0x100000c2 = loop;
  memset(local_20,0,0xc);
  local_20 = (undefined1  [4])0x1;
  rc = -1;
  local_24 = 0;
  iVar1 = epoll_ctl(stack0xfffffffffffffff0->backend_fd,1,e.data.fd,(epoll_event *)local_20);
  if ((iVar1 != 0) && (piVar2 = __errno_location(), *piVar2 != 0x11)) {
    piVar2 = __errno_location();
    local_24 = -*piVar2;
  }
  if ((local_24 == 0) &&
     (iVar1 = epoll_ctl(stack0xfffffffffffffff0->backend_fd,2,e.data.fd,(epoll_event *)local_20),
     iVar1 != 0)) {
    abort();
  }
  return local_24;
}

Assistant:

int uv__io_check_fd(uv_loop_t* loop, int fd) {
  struct epoll_event e;
  int rc;

  memset(&e, 0, sizeof(e));
  e.events = POLLIN;
  e.data.fd = -1;

  rc = 0;
  if (epoll_ctl(loop->backend_fd, EPOLL_CTL_ADD, fd, &e))
    if (errno != EEXIST)
      rc = UV__ERR(errno);

  if (rc == 0)
    if (epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, &e))
      abort();

  return rc;
}